

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O0

vector<IRT::CTemp,_std::allocator<IRT::CTemp>_> * __thiscall
AssemblyCode::NameCommand::GetOut
          (vector<IRT::CTemp,_std::allocator<IRT::CTemp>_> *__return_storage_ptr__,NameCommand *this
          )

{
  initializer_list<IRT::CTemp> __l;
  CTemp *local_80;
  allocator<IRT::CTemp> local_5d [13];
  CTemp *local_50;
  CTemp local_48;
  iterator local_28;
  size_type local_20;
  NameCommand *local_18;
  NameCommand *this_local;
  
  local_50 = &local_48;
  local_18 = this;
  this_local = (NameCommand *)__return_storage_ptr__;
  IRT::CTemp::CTemp(local_50,&this->target);
  local_28 = &local_48;
  local_20 = 1;
  std::allocator<IRT::CTemp>::allocator(local_5d);
  __l._M_len = local_20;
  __l._M_array = local_28;
  std::vector<IRT::CTemp,_std::allocator<IRT::CTemp>_>::vector(__return_storage_ptr__,__l,local_5d);
  std::allocator<IRT::CTemp>::~allocator(local_5d);
  local_80 = (CTemp *)&local_28;
  do {
    local_80 = local_80 + -1;
    IRT::CTemp::~CTemp(local_80);
  } while (local_80 != &local_48);
  return __return_storage_ptr__;
}

Assistant:

std::vector<IRT::CTemp> AssemblyCode::NameCommand::GetOut( ) const {
    return { target };
}